

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

bool __thiscall
slang::IntervalMap<int,_int,_0U>::iterator::insertNode
          (iterator *this,uint32_t level,NodeRef node,interval<int> *key,allocator_type *alloc)

{
  Path *this_00;
  uint uVar1;
  int iVar2;
  IntervalMap<int,_int,_0U> *this_01;
  void *pvVar3;
  uint32_t uVar4;
  IndexPair offset;
  uint uVar5;
  pointer pEVar6;
  uint32_t *puVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  
  this_00 = &(this->super_const_iterator).path;
  bVar13 = level == 1;
  if (bVar13) {
    this_01 = (this->super_const_iterator).map;
    uVar5 = this_01->rootSize;
    uVar10 = ((this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)->
             offset;
    if (uVar5 < 0xc) {
      while (uVar5 != uVar10) {
        uVar11 = (ulong)uVar5;
        uVar5 = uVar5 - 1;
        *(undefined8 *)((long)&this_01->field_0 + uVar11 * 8) =
             *(undefined8 *)((long)&this_01->field_0 + (ulong)uVar5 * 8);
        *(undefined8 *)((long)&this_01->field_0 + uVar11 * 8 + 0x60) =
             *(undefined8 *)((long)&this_01->field_0 + (ulong)uVar5 * 8 + 0x60);
      }
      *(PointerIntPair<void_*,_6U,_6U,_unsigned_int> *)((long)&this_01->field_0 + (ulong)uVar10 * 8)
           = node.pip.value;
      *(interval<int> *)((long)&this_01->field_0 + (ulong)uVar10 * 8 + 0x60) = *key;
      uVar4 = this_01->rootSize + 1;
      this_01->rootSize = uVar4;
      pEVar6 = (this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
      pEVar6->size = uVar4;
      uVar11 = *(ulong *)((long)pEVar6->node + (ulong)pEVar6->offset * 8);
      pEVar6[1].node = (void *)(uVar11 & 0xffffffffffffffc0);
      pEVar6[1].size = ((uint)uVar11 & 0x3f) + 1;
      return false;
    }
    offset = IntervalMap<int,int,0u>::
             modifyRoot<slang::IntervalMapDetails::BranchNode<int,12u,true>,slang::IntervalMapDetails::BranchNode<int,12u,false>,false>
                       ((IntervalMap<int,int,0u> *)this_01,(BranchNode<int,_12U,_true> *)this_01,
                        uVar10,alloc);
    IntervalMapDetails::Path::replaceRoot<slang::IntervalMapDetails::BranchNode<int,12u,true>>
              (this_00,(BranchNode<int,_12U,_true> *)this_01,this_01->rootSize,offset);
    level = 2;
  }
  uVar10 = level - 1;
  uVar11 = (ulong)uVar10;
  IntervalMapDetails::Path::legalizeForInsert(this_00,uVar10);
  pEVar6 = (this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  uVar5 = pEVar6[uVar11].size;
  if (uVar5 == 0xc) {
    bVar13 = IntervalMap<int,int,0u>::iterator::
             overflow<slang::IntervalMapDetails::BranchNode<int,12u,false>>
                       ((iterator *)this,uVar10,alloc);
    if (bVar13) {
      uVar10 = level;
    }
    uVar11 = (ulong)uVar10;
    pEVar6 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    uVar5 = pEVar6[uVar11].size;
  }
  pvVar3 = pEVar6[uVar11].node;
  uVar1 = pEVar6[uVar11].offset;
  while (uVar5 != uVar1) {
    uVar12 = (ulong)uVar5;
    uVar5 = uVar5 - 1;
    *(undefined8 *)((long)pvVar3 + uVar12 * 8) = *(undefined8 *)((long)pvVar3 + (ulong)uVar5 * 8);
    *(undefined8 *)((long)pvVar3 + uVar12 * 8 + 0x60) =
         *(undefined8 *)((long)pvVar3 + (ulong)uVar5 * 8 + 0x60);
  }
  ((PointerIntPair<void_*,_6U,_6U,_unsigned_int> *)((long)pvVar3 + (ulong)uVar1 * 8))->value =
       (uintptr_t)node.pip.value;
  *(interval<int> *)((long)pvVar3 + (ulong)uVar1 * 8 + 0x60) = *key;
  pEVar6 = (this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  uVar5 = pEVar6[uVar11].size;
  pEVar6[uVar11].size = uVar5 + 1;
  if (uVar10 != 0) {
    *(ulong *)((long)pEVar6[uVar10 - 1].node + (ulong)pEVar6[uVar10 - 1].offset * 8) =
         *(ulong *)((long)pEVar6[uVar10 - 1].node + (ulong)pEVar6[uVar10 - 1].offset * 8) &
         0xffffffffffffffc0 | (ulong)uVar5;
    puVar7 = &pEVar6[uVar11 - 1].offset;
    uVar12 = uVar11;
    do {
      uVar8 = (ulong)*puVar7;
      pvVar3 = ((Entry *)(puVar7 + -3))->node;
      iVar9 = *(int *)((long)pvVar3 + uVar8 * 8 + 0x60);
      iVar2 = *(int *)((long)pvVar3 + uVar8 * 8 + 100);
      if (key->left < iVar9) {
        iVar9 = key->left;
      }
      *(int *)((long)pvVar3 + uVar8 * 8 + 0x60) = iVar9;
      iVar9 = key->right;
      if (key->right < iVar2) {
        iVar9 = iVar2;
      }
      puVar7 = puVar7 + -4;
      *(int *)((long)pvVar3 + uVar8 * 8 + 100) = iVar9;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  uVar11 = *(ulong *)((long)pEVar6[uVar11].node + (ulong)pEVar6[uVar11].offset * 8);
  pEVar6[uVar10 + 1].node = (void *)(uVar11 & 0xffffffffffffffc0);
  pEVar6[uVar10 + 1].size = ((uint)uVar11 & 0x3f) + 1;
  return bVar13;
}

Assistant:

bool IntervalMap<TKey, TValue, N>::iterator::insertNode(
    uint32_t level, IntervalMapDetails::NodeRef node, const IntervalMapDetails::interval<TKey>& key,
    allocator_type& alloc) {
    SLANG_ASSERT(level > 0);

    bool split = false;
    auto& map = *this->map;
    auto& path = this->path;

    if (level == 1) {
        // Insert into the root branch node.
        if (map.rootSize < RootBranch::Capacity) {
            map.rootBranch.insert(path.offset(0), map.rootSize, node, key);
            path.setSize(0, ++map.rootSize);
            path.reset(level);
            return false;
        }

        // We need to split the root while keeping our position.
        split = true;
        auto newOffset = map.splitRoot(path.offset(0), alloc);
        path.replaceRoot(&map.rootBranch, map.rootSize, newOffset);

        // Fall through to insert at the new higher level.
        level++;
    }

    // When inserting before end, make sure we have a valid path.
    path.legalizeForInsert(--level);

    if (path.size(level) == Branch::Capacity) {
        // Branch node is full, we need to split it.
        SLANG_ASSERT(!split);
        split = overflow<Branch>(level, alloc);
        if (split)
            level++;
    }

    // Actually insert into the branch node.
    path.template node<Branch>(level).insert(path.offset(level), path.size(level), node, key);
    path.setSize(level, path.size(level) + 1);
    updateParentBounds(level, key);

    path.reset(level + 1);
    return split;
}